

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

cmd_ln_t * cmd_ln_parse_r(cmd_ln_t *inout_cmdln,arg_t *defn,int32 argc,char **argv,int strict)

{
  uint uVar1;
  int32 iVar2;
  cmd_ln_t *cmdln;
  hash_table_t *phVar3;
  arg_t *paVar4;
  hash_table_t *phVar5;
  cmd_ln_val_t *val;
  cmd_ln_val_t *pcVar6;
  FILE *pFVar7;
  int iVar8;
  char *fmt;
  ulong uVar9;
  char *pcVar10;
  uint size;
  long lVar11;
  void *v;
  cmd_ln_val_t *local_50;
  hash_table_t *local_48;
  arg_t *local_40;
  cmd_ln_t *local_38;
  
  cmdln = inout_cmdln;
  if (inout_cmdln == (cmd_ln_t *)0x0) {
    cmdln = (cmd_ln_t *)
            __ckd_calloc__(1,0x20,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                           ,0x234);
    cmdln->refcount = 1;
  }
  phVar3 = hash_table_new(0x32,0);
  size = 0;
  local_40 = defn;
  if ((defn != (arg_t *)0x0) && (pcVar10 = defn->name, size = 0, pcVar10 != (char *)0x0)) {
    size = 0;
    do {
      paVar4 = (arg_t *)hash_table_enter(phVar3,pcVar10,defn);
      iVar8 = 0;
      if ((strict != 0) && (defn != paVar4)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x242,"Duplicate argument name in definition: %s\n",defn->name);
        iVar8 = 5;
      }
      if (iVar8 != 0) goto joined_r0x00104c95;
      pcVar10 = defn[1].name;
      defn = defn + 1;
      size = size + 1;
    } while (pcVar10 != (char *)0x0);
  }
  if (cmdln->ht == (hash_table_t *)0x0) {
    phVar5 = hash_table_new(size,0);
    cmdln->ht = phVar5;
  }
  if (argc < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = (uint)(**argv != '-');
  }
  local_48 = phVar3;
  local_38 = inout_cmdln;
  if ((int)uVar1 < argc) {
    uVar9 = (ulong)uVar1;
    do {
      paVar4 = local_40;
      iVar2 = hash_table_lookup(local_48,argv[uVar9],&local_50);
      if (iVar2 < 0) {
        if (strict != 0) {
          pcVar10 = argv[uVar9];
          lVar11 = 0x25f;
          fmt = "Unknown argument name \'%s\'\n";
          goto LAB_00104a1f;
        }
        iVar8 = 8;
        if (local_40 == (arg_t *)0x0) {
          local_50 = (cmd_ln_val_t *)0x0;
          paVar4 = local_40;
          goto LAB_00104945;
        }
      }
      else {
LAB_00104945:
        pcVar6 = local_50;
        if ((int)uVar9 + 1 < argc) {
          if (local_50 == (cmd_ln_val_t *)0x0) {
            val = cmd_ln_val_init(8,argv[uVar9],argv[uVar9 + 1]);
          }
          else {
            val = cmd_ln_val_init(local_50->type,argv[uVar9],argv[uVar9 + 1]);
            if (val == (cmd_ln_val_t *)0x0) {
              cmd_ln_print_help_r(cmdln,_stderr,paVar4);
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                      ,0x276,"Bad argument value for %s: %s\n",argv[uVar9],argv[uVar9 + 1]);
              iVar8 = 5;
              goto LAB_00104af5;
            }
          }
          local_50 = (cmd_ln_val_t *)hash_table_enter(cmdln->ht,val->name,val);
          iVar8 = 0;
          if (local_50 != val) {
            if (strict == 0) {
              local_50 = (cmd_ln_val_t *)hash_table_replace(cmdln->ht,val->name,val);
              cmd_ln_val_free(local_50);
              iVar8 = 0;
            }
            else {
              cmd_ln_val_free(val);
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                      ,0x281,"Duplicate argument name in arguments: %s\n",(pcVar6->val).ptr);
              iVar8 = 5;
            }
          }
        }
        else {
          cmd_ln_print_help_r(cmdln,_stderr,paVar4);
          pcVar10 = argv[uVar9];
          lVar11 = 0x26c;
          fmt = "Argument value for \'%s\' missing\n";
LAB_00104a1f:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,lVar11,fmt,pcVar10);
          iVar8 = 5;
        }
      }
LAB_00104af5:
      if ((iVar8 != 0) && (inout_cmdln = local_38, phVar3 = local_48, iVar8 != 8))
      goto joined_r0x00104c95;
      uVar9 = uVar9 + 2;
    } while ((int)uVar9 < argc);
  }
  paVar4 = local_40;
  if (size != 0) {
    lVar11 = 0;
    do {
      iVar2 = hash_table_lookup(cmdln->ht,*(char **)((long)&paVar4->name + lVar11),&local_50);
      iVar8 = 0;
      if (iVar2 < 0) {
        pcVar6 = cmd_ln_val_init(*(int *)((long)&paVar4->type + lVar11),
                                 *(char **)((long)&paVar4->name + lVar11),
                                 *(char **)((long)&paVar4->deflt + lVar11));
        if (pcVar6 == (cmd_ln_val_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x294,"Bad default argument value for %s: %s\n",
                  *(undefined8 *)((long)&paVar4->name + lVar11),
                  *(undefined8 *)((long)&paVar4->deflt + lVar11));
          iVar8 = 5;
        }
        else {
          hash_table_enter(cmdln->ht,pcVar6->name,pcVar6);
          iVar8 = 0;
        }
      }
      inout_cmdln = local_38;
      phVar3 = local_48;
      if (iVar8 != 0) {
joined_r0x00104c95:
        if (iVar8 != 5) {
          return cmdln;
        }
        if (phVar3 != (hash_table_t *)0x0) {
          hash_table_free(phVar3);
        }
        if (inout_cmdln == (cmd_ln_t *)0x0) {
          cmd_ln_free_r(cmdln);
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x2bf,"Failed to parse arguments list\n");
        return (cmd_ln_t *)0x0;
      }
      lVar11 = lVar11 + 0x20;
    } while ((ulong)size << 5 != lVar11);
    lVar11 = 0;
    do {
      if (((*(byte *)((long)&paVar4->type + lVar11) & 1) != 0) &&
         (iVar2 = hash_table_lookup(cmdln->ht,*(char **)((long)&paVar4->name + lVar11),&local_50),
         iVar2 != 0)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x2a1,"Missing required argument %s\n",
                *(undefined8 *)((long)&paVar4->name + lVar11));
      }
      lVar11 = lVar11 + 0x20;
    } while ((ulong)size << 5 != lVar11);
  }
  if (argc == 1 && strict != 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x2aa,"No arguments given, available options are:\n");
    cmd_ln_print_help_r(cmdln,_stderr,paVar4);
    if (local_48 != (hash_table_t *)0x0) {
      hash_table_free(local_48);
    }
    if (local_38 == (cmd_ln_t *)0x0) {
      cmd_ln_free_r(cmdln);
    }
    cmdln = (cmd_ln_t *)0x0;
  }
  else {
    pFVar7 = err_get_logfp();
    phVar3 = local_48;
    if (pFVar7 != (FILE *)0x0) {
      pFVar7 = err_get_logfp();
      cmd_ln_print_values_r(cmdln,pFVar7,paVar4);
    }
    hash_table_free(phVar3);
  }
  return cmdln;
}

Assistant:

cmd_ln_t *
cmd_ln_parse_r(cmd_ln_t *inout_cmdln, const arg_t * defn, int32 argc, char *argv[], int strict)
{
    int32 i, j, n, argstart;
    hash_table_t *defidx = NULL;
    cmd_ln_t *cmdln;

    /* Construct command-line object */
    if (inout_cmdln == NULL) {
        cmdln = (cmd_ln_t*)ckd_calloc(1, sizeof(*cmdln));
        cmdln->refcount = 1;
    }
    else
        cmdln = inout_cmdln;

    /* Build a hash table for argument definitions */
    defidx = hash_table_new(50, 0);
    if (defn) {
        for (n = 0; defn[n].name; n++) {
            void *v;

            v = hash_table_enter(defidx, defn[n].name, (void *)&defn[n]);
            if (strict && (v != &defn[n])) {
                E_ERROR("Duplicate argument name in definition: %s\n", defn[n].name);
                goto error;
            }
        }
    }
    else {
        /* No definitions. */
        n = 0;
    }

    /* Allocate memory for argument values */
    if (cmdln->ht == NULL)
        cmdln->ht = hash_table_new(n, 0 /* argument names are case-sensitive */ );


    /* skip argv[0] if it doesn't start with dash */
    argstart = 0;
    if (argc > 0 && argv[0][0] != '-') {
        argstart = 1;
    }

    /* Parse command line arguments (name-value pairs) */
    for (j = argstart; j < argc; j += 2) {
        arg_t *argdef;
        cmd_ln_val_t *val;
        void *v;

        if (hash_table_lookup(defidx, argv[j], &v) < 0) {
            if (strict) {
                E_ERROR("Unknown argument name '%s'\n", argv[j]);
                goto error;
            }
            else if (defn == NULL)
                v = NULL;
            else
                continue;
        }
        argdef = (arg_t *)v;

        /* Enter argument value */
        if (j + 1 >= argc) {
            cmd_ln_print_help_r(cmdln, stderr, defn);
            E_ERROR("Argument value for '%s' missing\n", argv[j]);
            goto error;
        }

        if (argdef == NULL)
            val = cmd_ln_val_init(ARG_STRING, argv[j], argv[j + 1]);
        else {
            if ((val = cmd_ln_val_init(argdef->type, argv[j], argv[j + 1])) == NULL) {
                cmd_ln_print_help_r(cmdln, stderr, defn);
                E_ERROR("Bad argument value for %s: %s\n", argv[j],
                        argv[j + 1]);
                goto error;
            }
        }

        if ((v = hash_table_enter(cmdln->ht, val->name, (void *)val)) !=
            (void *)val)
        {
            if (strict) {
                cmd_ln_val_free(val);
                E_ERROR("Duplicate argument name in arguments: %s\n",
                        argdef->name);
                goto error;
            }
            else {
                v = hash_table_replace(cmdln->ht, val->name, (void *)val);
                cmd_ln_val_free((cmd_ln_val_t *)v);
            }
        }
    }

    /* Fill in default values, if any, for unspecified arguments */
    for (i = 0; i < n; i++) {
        cmd_ln_val_t *val;
        void *v;

        if (hash_table_lookup(cmdln->ht, defn[i].name, &v) < 0) {
            if ((val = cmd_ln_val_init(defn[i].type, defn[i].name, defn[i].deflt)) == NULL) {
                E_ERROR
                    ("Bad default argument value for %s: %s\n",
                     defn[i].name, defn[i].deflt);
                goto error;
            }
            hash_table_enter(cmdln->ht, val->name, (void *)val);
        }
    }

    /* Check for required arguments; exit if any missing */
    j = 0;
    for (i = 0; i < n; i++) {
        if (defn[i].type & ARG_REQUIRED) {
            void *v;
            if (hash_table_lookup(cmdln->ht, defn[i].name, &v) != 0)
                E_ERROR("Missing required argument %s\n", defn[i].name);
        }
    }
    if (j > 0) {
        cmd_ln_print_help_r(cmdln, stderr, defn);
        goto error;
    }

    if (strict && argc == 1) {
        E_ERROR("No arguments given, available options are:\n");
        cmd_ln_print_help_r(cmdln, stderr, defn);
        if (defidx)
            hash_table_free(defidx);
        if (inout_cmdln == NULL)
            cmd_ln_free_r(cmdln);
        return NULL;
    }

    /* Print current values always in SphinxTrain */
    if (err_get_logfp())
	cmd_ln_print_values_r(cmdln, err_get_logfp(), defn);

    hash_table_free(defidx);
    return cmdln;

  error:
    if (defidx)
        hash_table_free(defidx);
    if (inout_cmdln == NULL)
        cmd_ln_free_r(cmdln);
    E_ERROR("Failed to parse arguments list\n");
    return NULL;
}